

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

Float __thiscall
pbrt::HairBxDF::PDF(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
                   BxDFReflTransFlags sampleFlags)

{
  Float FVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int p;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  Float FVar16;
  float fVar17;
  float fVar18;
  Float FVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar21 [16];
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar22 [64];
  undefined1 auVar24 [56];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined8 in_XMM2_Qb;
  undefined1 in_register_00001344 [12];
  array<float,_4> aVar31;
  array<float,_4> apPDF;
  uint local_b0;
  float local_a8;
  uint uStack_a4;
  undefined8 uStack_a0;
  float local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_78;
  undefined1 local_58 [16];
  undefined1 local_38 [16];
  float local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  undefined1 auVar20 [16];
  undefined1 extraout_var [60];
  undefined1 auVar30 [56];
  
  local_78 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  local_98 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_90 = (undefined4)in_XMM0_Qb;
  uStack_8c = (undefined4)((ulong)in_XMM0_Qb >> 0x20);
  auVar20 = vmaxss_avx(ZEXT416((uint)(1.0 - local_98 * local_98)),ZEXT816(0));
  if (auVar20._0_4_ < 0.0) {
    auVar22._0_4_ = sqrtf(auVar20._0_4_);
    auVar22._4_60_ = extraout_var;
    auVar20 = auVar22._0_16_;
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
  }
  auVar12._8_4_ = uStack_90;
  auVar12._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._12_4_ = uStack_8c;
  auVar12 = vmovshdup_avx(auVar12);
  fVar13 = atan2f(wo.super_Tuple3<pbrt::Vector3,_float>.z,auVar12._0_4_);
  auVar25._0_12_ = ZEXT812(0);
  auVar25._12_4_ = 0;
  auVar12 = vmaxss_avx(ZEXT416((uint)(1.0 - local_78 * local_78)),auVar25);
  if (auVar12._0_4_ < 0.0) {
    FVar19 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    FVar19 = auVar12._0_4_;
  }
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12 = vmovshdup_avx(auVar9);
  fVar14 = atan2f(wi.super_Tuple3<pbrt::Vector3,_float>.z,auVar12._0_4_);
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)this->eta),ZEXT416((uint)this->eta),
                            ZEXT416((uint)(local_98 * local_98)));
  auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x40);
  local_b0 = 0;
  if (auVar12._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar15 = auVar12._0_4_;
  }
  local_a8 = auVar20._0_4_;
  auVar26._0_4_ = this->h / (fVar15 / local_a8);
  auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar30 = ZEXT856(0);
  auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
  uVar4 = vcmpss_avx512f(auVar26,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar15 = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar12._0_4_));
  uStack_a0 = auVar20._8_8_;
  auVar24 = ZEXT856(uStack_a0);
  aVar31 = ComputeApPDF(this,local_a8);
  auVar29._0_8_ = aVar31.values._8_8_;
  auVar29._8_56_ = auVar30;
  auVar23._0_8_ = aVar31.values._0_8_;
  auVar23._8_56_ = auVar24;
  local_38 = vmovlhps_avx(auVar23._0_16_,auVar29._0_16_);
  uStack_a4 = auVar20._4_4_;
  uStack_a0._0_4_ = auVar20._8_4_;
  uStack_a0._4_4_ = auVar20._12_4_;
  local_28 = -local_a8;
  uStack_24 = uStack_a4 ^ 0x80000000;
  uStack_20 = (uint)uStack_a0 ^ 0x80000000;
  uStack_1c = uStack_a0._4_4_ ^ 0x80000000;
  lVar11 = 0;
  do {
    iVar10 = (int)lVar11;
    if (iVar10 == 2) {
      FVar16 = this->sin2kAlpha[2];
      FVar1 = this->cos2kAlpha[2];
LAB_0034bb74:
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_a8 * FVar16)),ZEXT416((uint)FVar1),
                                ZEXT416((uint)local_98));
      fVar17 = auVar12._0_4_;
      auVar12 = vfmadd231ss_fma(ZEXT416((uint)(FVar16 * -local_98)),auVar20,ZEXT416((uint)FVar1));
    }
    else {
      if (iVar10 == 1) {
        FVar16 = this->sin2kAlpha[0];
        FVar1 = this->cos2kAlpha[0];
        goto LAB_0034bb74;
      }
      auVar12 = auVar20;
      fVar17 = local_98;
      if (iVar10 == 0) {
        auVar8._8_4_ = uStack_90;
        auVar8._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar8._12_4_ = uStack_8c;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(this->sin2kAlpha[1] * local_28)),auVar8,
                                  ZEXT416((uint)this->cos2kAlpha[1]));
        fVar17 = auVar12._0_4_;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_98 * this->sin2kAlpha[1])),
                                  ZEXT416((uint)this->cos2kAlpha[1]),ZEXT416((uint)local_a8));
      }
    }
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx512vl(auVar12,auVar6);
    FVar16 = Mp(FVar19,auVar12._0_4_,local_78,fVar17,this->v[lVar11]);
    auVar27._0_4_ = (float)(iVar10 * 2);
    auVar27._4_12_ = in_register_00001344;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(this->gamma_o * -2.0)),auVar27,ZEXT416((uint)fVar15));
    auVar28._0_4_ = (float)iVar10;
    auVar28._4_12_ = in_register_00001344;
    auVar12 = vfmadd213ss_fma(auVar28,SUB6416(ZEXT464(0x40490fdb),0),auVar12);
    for (fVar17 = (fVar14 - fVar13) - auVar12._0_4_; 3.1415927 < fVar17;
        fVar17 = fVar17 + -6.2831855) {
    }
    fVar2 = *(float *)(local_38 + lVar11 * 4);
    fVar3 = this->s;
    for (; fVar17 < -3.1415927; fVar17 = fVar17 + 6.2831855) {
    }
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar12 = vorps_avx512vl(ZEXT416((uint)fVar17),auVar7);
    fVar17 = auVar12._0_4_ / fVar3;
    local_58._0_4_ = expf(fVar17);
    local_58._4_4_ = extraout_XMM0_Db;
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._12_4_ = extraout_XMM0_Dd;
    fVar17 = expf(fVar17);
    fVar18 = expf(-3.1415927 / fVar3);
    auVar25 = vinsertps_avx(ZEXT416((uint)(fVar3 * (fVar17 + 1.0) * (fVar17 + 1.0))),
                            ZEXT416((uint)(fVar18 + 1.0)),0x10);
    auVar12 = vblendps_avx(local_58,_DAT_00553320,0xe);
    auVar12 = vdivps_avx(auVar12,auVar25);
    fVar17 = expf(3.1415927 / fVar3);
    auVar25 = vmovshdup_avx(auVar12);
    auVar21._0_4_ = auVar12._0_4_ / (auVar25._0_4_ - 1.0 / (fVar17 + 1.0));
    auVar21._4_12_ = auVar12._4_12_;
    auVar12 = vfmadd231ss_fma(ZEXT416(local_b0),auVar21,ZEXT416((uint)(FVar16 * fVar2)));
    local_b0 = auVar12._0_4_;
    lVar11 = lVar11 + 1;
    if (lVar11 == 3) {
      FVar19 = Mp(FVar19,local_a8,local_78,local_98,this->v[3]);
      auVar20 = vfmadd231ss_fma(ZEXT416(local_b0),ZEXT416((uint)(FVar19 * (float)local_38._12_4_)),
                                ZEXT416(0x3e22f983));
      return auVar20._0_4_;
    }
  } while( true );
}

Assistant:

Float HairBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                    BxDFReflTransFlags sampleFlags) const {
    // TODO? flags...

    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute PDF for $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF = ComputeApPDF(cosTheta_o);

    // Compute PDF sum for hair scattering events
    Float phi = phi_i - phi_o;
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin \thetao$ and $\cos \thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }

        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos \thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);
        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(phi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));
    return pdf;
}